

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O3

void __thiscall
FileTarget::FileTarget(FileTarget *this,string *aSource,string *aTarget,PackFormat pf,uint64_t offs)

{
  pointer pcVar1;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&this->source,aSource)
  ;
  (this->target)._M_dataplus._M_p = (pointer)&(this->target).field_2;
  pcVar1 = (aTarget->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target,pcVar1,pcVar1 + aTarget->_M_string_length);
  this->size = 0;
  this->packFormat = pf;
  this->offset = offs;
  return;
}

Assistant:

FileTarget(const std::string& aSource = "", const std::string& aTarget = "",
               PackFormat pf = INTEL_COMPRESSED, uint64_t offs = 0xffffffff)
        : source(aSource), target(aTarget), packFormat(pf), offset(offs)
    {}